

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

int __thiscall UniValue::get_int(UniValue *this)

{
  bool bVar1;
  runtime_error *prVar2;
  string *str;
  int local_20 [2];
  int32_t retval;
  UniValue *local_10;
  UniValue *this_local;
  
  local_10 = this;
  if (this->typ != VNUM) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON value is not an integer as expected");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str = getValStr_abi_cxx11_(this);
  bVar1 = anon_unknown.dwarf_845ce5::ParseInt32(str,local_20);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON integer out of range");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_20[0];
}

Assistant:

int UniValue::get_int() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not an integer as expected");
    int32_t retval;
    if (!ParseInt32(getValStr(), &retval))
        throw std::runtime_error("JSON integer out of range");
    return retval;
}